

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::VertexArrays::AttributeFormatTest::PrepareVAO<short>
          (AttributeFormatTest *this,GLint size,GLenum type_gl_name,bool normalized,
          AtributeFormatFunctionType function_selector)

{
  GLuint GVar1;
  code *pcVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 uVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  undefined4 *puVar8;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar9;
  Enum<int,_2UL> EVar10;
  char *local_360;
  char *local_300;
  char *local_2f8;
  char *local_2f0;
  double local_250;
  char *local_240;
  GetNameFunc local_238;
  int local_230;
  Enum<int,_2UL> local_228;
  GetNameFunc local_218;
  int local_210;
  Enum<int,_2UL> local_208 [2];
  char *local_1e8;
  MessageBuilder local_1e0;
  int local_5c;
  undefined2 local_58;
  undefined2 local_56;
  GLenum error;
  short array_data [16];
  GLdouble scale;
  Functions *gl;
  AtributeFormatFunctionType function_selector_local;
  GLint GStack_1c;
  bool normalized_local;
  GLenum type_gl_name_local;
  GLint size_local;
  AttributeFormatTest *this_local;
  long lVar7;
  
  GStack_1c = size;
  _type_gl_name_local = this;
  pRVar6 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar6->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar3);
  (**(code **)(lVar7 + 0x708))(1,&this->m_vao);
  dVar4 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar4,"glGenVertexArrays call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x872);
  (**(code **)(lVar7 + 0xd8))(this->m_vao);
  dVar4 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar4,"glBindVertexArray call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x875);
  if (normalized) {
    local_250 = NormalizationScaleFactor<short>(this);
  }
  else {
    local_250 = 1.0;
  }
  array_data._24_8_ = local_250;
  local_58 = (undefined2)(int)(local_250 * 0.0);
  local_56 = (undefined2)(int)local_250;
  error._0_2_ = (undefined2)(int)(local_250 + local_250);
  error._2_2_ = (undefined2)(int)(local_250 * 3.0);
  array_data[0] = (short)(int)(local_250 * 4.0);
  array_data[1] = (short)(int)(local_250 * 5.0);
  array_data[2] = (short)(int)(local_250 * 6.0);
  array_data[3] = (short)(int)(local_250 * 7.0);
  array_data[4] = (short)(int)(local_250 * 8.0);
  array_data[5] = (short)(int)(local_250 * 9.0);
  array_data[6] = (short)(int)(local_250 * 10.0);
  array_data[7] = (short)(int)(local_250 * 11.0);
  array_data[8] = (short)(int)(local_250 * 12.0);
  array_data[9] = (short)(int)(local_250 * 13.0);
  array_data[10] = (short)(int)(local_250 * 14.0);
  array_data[0xb] = (short)(int)(local_250 * 15.0);
  (**(code **)(lVar7 + 0x6c8))(1,&this->m_bo_array);
  dVar4 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar4,"glGenBuffers call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x881);
  (**(code **)(lVar7 + 0x40))(0x8892,this->m_bo_array);
  dVar4 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar4,"glBindBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x884);
  (**(code **)(lVar7 + 0x150))(0x8892,0x20,&local_58,0x88e4);
  dVar4 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar4,"glBufferData call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x887);
  pcVar2 = *(code **)(lVar7 + 0x1898);
  uVar5 = (**(code **)(lVar7 + 0x780))(this->m_po,"a_0");
  (*pcVar2)(uVar5,0);
  dVar4 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar4,"glVertexAttribBinding call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x88b);
  pcVar2 = *(code **)(lVar7 + 0x1898);
  uVar5 = (**(code **)(lVar7 + 0x780))(this->m_po,"a_1");
  (*pcVar2)(uVar5,1);
  dVar4 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar4,"glVertexAttribBinding call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x88e);
  if (function_selector == ATTRIBUTE_FORMAT_FUNCTION_FLOAT) {
    pcVar2 = *(code **)(lVar7 + 0x16a8);
    GVar1 = this->m_vao;
    uVar5 = (**(code **)(lVar7 + 0x780))(this->m_po,"a_0");
    (*pcVar2)(GVar1,uVar5,GStack_1c,type_gl_name,normalized,0);
    pcVar2 = *(code **)(lVar7 + 0x16a8);
    GVar1 = this->m_vao;
    uVar5 = (**(code **)(lVar7 + 0x780))(this->m_po,"a_1");
    (*pcVar2)(GVar1,uVar5,GStack_1c,type_gl_name,normalized,0);
  }
  else if (function_selector == ATTRIBUTE_FORMAT_FUNCTION_DOUBLE) {
    pcVar2 = *(code **)(lVar7 + 0x16b8);
    GVar1 = this->m_vao;
    uVar5 = (**(code **)(lVar7 + 0x780))(this->m_po,"a_0");
    (*pcVar2)(GVar1,uVar5,GStack_1c,type_gl_name,0);
    pcVar2 = *(code **)(lVar7 + 0x16b8);
    GVar1 = this->m_vao;
    uVar5 = (**(code **)(lVar7 + 0x780))(this->m_po,"a_1");
    (*pcVar2)(GVar1,uVar5,GStack_1c,type_gl_name,0);
  }
  else {
    if (function_selector != ATTRIBUTE_FORMAT_FUNCTION_INTEGER) {
      puVar8 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar8 = 0;
      __cxa_throw(puVar8,&int::typeinfo,0);
    }
    pcVar2 = *(code **)(lVar7 + 0x16b0);
    GVar1 = this->m_vao;
    uVar5 = (**(code **)(lVar7 + 0x780))(this->m_po,"a_0");
    (*pcVar2)(GVar1,uVar5,GStack_1c,type_gl_name,0);
    pcVar2 = *(code **)(lVar7 + 0x16b0);
    GVar1 = this->m_vao;
    uVar5 = (**(code **)(lVar7 + 0x780))(this->m_po,"a_1");
    (*pcVar2)(GVar1,uVar5,GStack_1c,type_gl_name,0);
  }
  local_5c = (**(code **)(lVar7 + 0x800))();
  if (local_5c == 0) {
    (**(code **)(lVar7 + 0xe0))(0,this->m_bo_array,0,(long)GStack_1c << 2);
    (**(code **)(lVar7 + 0xe0))(1,this->m_bo_array,(long)GStack_1c * 2,(long)GStack_1c << 2);
    dVar4 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar4,"glBufferData call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                    ,0x8be);
    (**(code **)(lVar7 + 0x610))(0);
    dVar4 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar4,"glEnableVertexAttribArray call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                    ,0x8c1);
    (**(code **)(lVar7 + 0x610))(1);
    dVar4 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar4,"glEnableVertexAttribArray call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                    ,0x8c4);
    (**(code **)(lVar7 + 0xd8))(0);
    dVar4 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar4,"glBindVertexArray call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                    ,0x8c7);
    this_local._7_1_ = true;
  }
  else {
    this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    this_01 = tcu::TestContext::getLog(this_00);
    tcu::TestLog::operator<<(&local_1e0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    if (function_selector == ATTRIBUTE_FORMAT_FUNCTION_FLOAT) {
      local_2f0 = "VertexArrayAttribFormat";
    }
    else {
      if (function_selector == ATTRIBUTE_FORMAT_FUNCTION_DOUBLE) {
        local_2f8 = "VertexArrayAttribLFormat";
      }
      else {
        if (function_selector == ATTRIBUTE_FORMAT_FUNCTION_INTEGER) {
          local_300 = "VertexArrayAttribIFormat";
        }
        else {
          local_300 = "VertexArrayAttrib?Format";
        }
        local_2f8 = local_300;
      }
      local_2f0 = local_2f8;
    }
    local_1e8 = local_2f0;
    pMVar9 = tcu::MessageBuilder::operator<<(&local_1e0,&local_1e8);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [29])0x2a7f4cc);
    EVar10 = glu::getErrorStr(local_5c);
    local_218 = EVar10.m_getName;
    local_210 = EVar10.m_value;
    local_208[0].m_getName = local_218;
    local_208[0].m_value = local_210;
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,local_208);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [28])"error for test with size = ");
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&stack0xffffffffffffffe4);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [10])", type = ");
    EVar10 = glu::getTypeStr(type_gl_name);
    local_238 = EVar10.m_getName;
    local_230 = EVar10.m_value;
    local_228.m_getName = local_238;
    local_228.m_value = local_230;
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_228);
    if (function_selector == ATTRIBUTE_FORMAT_FUNCTION_FLOAT) {
      local_360 = ", which was not normalized.";
      if (normalized) {
        local_360 = ", which was normalized.";
      }
    }
    else {
      local_360 = ".";
    }
    local_240 = local_360;
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_240);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [14])0x2a7f008);
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1e0);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool AttributeFormatTest::PrepareVAO(glw::GLint size, glw::GLenum type_gl_name, bool normalized,
									 AtributeFormatFunctionType function_selector)
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* VAO creation. */
	gl.genVertexArrays(1, &m_vao);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenVertexArrays call failed.");

	gl.bindVertexArray(m_vao);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray call failed.");

	/* Array buffer 0 creation. */

	const glw::GLdouble scale = normalized ? NormalizationScaleFactor<T>() : 1.0;

	const T array_data[16] = { (T)(0.0 * scale),  (T)(1.0 * scale),  (T)(2.0 * scale),  (T)(3.0 * scale),
							   (T)(4.0 * scale),  (T)(5.0 * scale),  (T)(6.0 * scale),  (T)(7.0 * scale),
							   (T)(8.0 * scale),  (T)(9.0 * scale),  (T)(10.0 * scale), (T)(11.0 * scale),
							   (T)(12.0 * scale), (T)(13.0 * scale), (T)(14.0 * scale), (T)(15.0 * scale) };

	gl.genBuffers(1, &m_bo_array);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers call failed.");

	gl.bindBuffer(GL_ARRAY_BUFFER, m_bo_array);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer call failed.");

	gl.bufferData(GL_ARRAY_BUFFER, sizeof(array_data), array_data, GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData call failed.");

	/* Attribute setup. */
	gl.vertexAttribBinding(gl.getAttribLocation(m_po, "a_0"), 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glVertexAttribBinding call failed.");

	gl.vertexAttribBinding(gl.getAttribLocation(m_po, "a_1"), 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glVertexAttribBinding call failed.");

	/* Tested attribute format setup. */
	switch (function_selector)
	{
	case ATTRIBUTE_FORMAT_FUNCTION_FLOAT:
		gl.vertexArrayAttribFormat(m_vao, gl.getAttribLocation(m_po, "a_0"), size, type_gl_name, normalized, 0);
		gl.vertexArrayAttribFormat(m_vao, gl.getAttribLocation(m_po, "a_1"), size, type_gl_name, normalized, 0);
		break;

	case ATTRIBUTE_FORMAT_FUNCTION_DOUBLE:
		gl.vertexArrayAttribLFormat(m_vao, gl.getAttribLocation(m_po, "a_0"), size, type_gl_name, 0);
		gl.vertexArrayAttribLFormat(m_vao, gl.getAttribLocation(m_po, "a_1"), size, type_gl_name, 0);
		break;

	case ATTRIBUTE_FORMAT_FUNCTION_INTEGER:
		gl.vertexArrayAttribIFormat(m_vao, gl.getAttribLocation(m_po, "a_0"), size, type_gl_name, 0);
		gl.vertexArrayAttribIFormat(m_vao, gl.getAttribLocation(m_po, "a_1"), size, type_gl_name, 0);
		break;
	default:
		throw 0;
	}

	if (glw::GLenum error = gl.getError())
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message
			<< ((ATTRIBUTE_FORMAT_FUNCTION_FLOAT == function_selector) ?
					"VertexArrayAttribFormat" :
					((ATTRIBUTE_FORMAT_FUNCTION_DOUBLE == function_selector) ?
						 "VertexArrayAttribLFormat" :
						 ((ATTRIBUTE_FORMAT_FUNCTION_INTEGER == function_selector) ? "VertexArrayAttribIFormat" :
																					 "VertexArrayAttrib?Format")))
			<< " has unexpectedly generated " << glu::getErrorStr(error) << "error for test with size = " << size
			<< ", type = " << glu::getTypeStr(type_gl_name)
			<< ((ATTRIBUTE_FORMAT_FUNCTION_FLOAT == function_selector) ?
					(normalized ? ", which was normalized." : ", which was not normalized.") :
					".")
			<< " Test fails.\n"
			<< tcu::TestLog::EndMessage;

		return false;
	}

	gl.bindVertexBuffer(0, m_bo_array, 0, static_cast<glw::GLsizei>(sizeof(T) * size * 2));
	gl.bindVertexBuffer(1, m_bo_array, (glw::GLintptr)((T*)NULL + size),
						static_cast<glw::GLsizei>(sizeof(T) * size * 2));

	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData call failed.");

	gl.enableVertexAttribArray(0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnableVertexAttribArray call failed.");

	gl.enableVertexAttribArray(1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnableVertexAttribArray call failed.");

	gl.bindVertexArray(0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray call failed.");

	return true;
}